

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceC.cpp
# Opt level: O0

char ** SoapySDRDevice_listTimeSources(SoapySDRDevice *device,size_t *length)

{
  undefined8 *in_RSI;
  long *in_RDI;
  exception *ex;
  size_t *in_stack_ffffffffffffffb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  undefined1 local_30 [32];
  long *local_10;
  char **local_8;
  
  *in_RSI = 0;
  local_10 = in_RDI;
  SoapySDRDevice_clearError();
  (**(code **)(*local_10 + 0x250))(local_30);
  local_8 = toStrArray(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_stack_ffffffffffffffc0);
  return local_8;
}

Assistant:

char **SoapySDRDevice_listTimeSources(const SoapySDRDevice *device, size_t *length)
{
    *length = 0;
    __SOAPY_SDR_C_TRY
    return toStrArray(device->listTimeSources(), length);
    __SOAPY_SDR_C_CATCH_RET(nullptr);
}